

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O1

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<18,_10,_10>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int i;
  float *pfVar1;
  long lVar2;
  undefined4 *puVar3;
  long lVar4;
  long lVar5;
  undefined4 uVar6;
  Vector<float,_3> res;
  Vector<float,_3> res_1;
  Type in1;
  Type in0;
  Vec4 *local_f0;
  undefined8 local_e8;
  float local_e0 [8];
  float local_c0 [3];
  float local_b4 [3];
  Matrix<float,_4,_3> local_a8;
  Matrix<float,_4,_3> local_78;
  Matrix<float,_4,_3> local_40;
  
  pfVar1 = (float *)&local_78;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    lVar2 = 0;
    lVar4 = 0;
    do {
      lVar5 = 0;
      do {
        uVar6 = 0x3f800000;
        if (lVar2 != lVar5) {
          uVar6 = 0;
        }
        *(undefined4 *)((long)pfVar1 + lVar5) = uVar6;
        lVar5 = lVar5 + 0x10;
      } while (lVar5 != 0x30);
      lVar4 = lVar4 + 1;
      pfVar1 = pfVar1 + 1;
      lVar2 = lVar2 + 0x10;
    } while (lVar4 != 4);
    local_78.m_data.m_data[0].m_data._0_8_ = *(undefined8 *)evalCtx->in[0].m_data;
    local_78.m_data.m_data[0].m_data._8_8_ = *(undefined8 *)(evalCtx->in[0].m_data + 2);
    local_78.m_data.m_data[1].m_data._0_8_ = *(undefined8 *)evalCtx->in[1].m_data;
    local_78.m_data.m_data[1].m_data._8_8_ = *(undefined8 *)(evalCtx->in[1].m_data + 2);
    local_78.m_data.m_data[2].m_data._0_8_ = *(undefined8 *)evalCtx->in[2].m_data;
    local_78.m_data.m_data[2].m_data._8_8_ = *(undefined8 *)(evalCtx->in[2].m_data + 2);
  }
  else {
    local_78.m_data.m_data[2].m_data[0] = 0.0;
    local_78.m_data.m_data[2].m_data[1] = 0.0;
    local_78.m_data.m_data[2].m_data[2] = 0.0;
    local_78.m_data.m_data[2].m_data[3] = 0.0;
    local_78.m_data.m_data[1].m_data[0] = 0.0;
    local_78.m_data.m_data[1].m_data[1] = 0.0;
    local_78.m_data.m_data[1].m_data[2] = 0.0;
    local_78.m_data.m_data[1].m_data[3] = 0.0;
    local_78.m_data.m_data[0].m_data[0] = 0.0;
    local_78.m_data.m_data[0].m_data[1] = 0.0;
    local_78.m_data.m_data[0].m_data[2] = 0.0;
    local_78.m_data.m_data[0].m_data[3] = 0.0;
    puVar3 = &sr::(anonymous_namespace)::s_constInMat3x4;
    lVar2 = 0;
    do {
      lVar4 = 0;
      do {
        pfVar1[lVar4] = *(float *)((long)puVar3 + lVar4);
        lVar4 = lVar4 + 4;
      } while (lVar4 != 0xc);
      lVar2 = lVar2 + 1;
      pfVar1 = pfVar1 + 1;
      puVar3 = puVar3 + 3;
    } while (lVar2 != 4);
  }
  pfVar1 = (float *)&local_a8;
  if (in1Type == INPUTTYPE_DYNAMIC) {
    lVar2 = 0;
    lVar4 = 0;
    do {
      lVar5 = 0;
      do {
        uVar6 = 0x3f800000;
        if (lVar2 != lVar5) {
          uVar6 = 0;
        }
        *(undefined4 *)((long)pfVar1 + lVar5) = uVar6;
        lVar5 = lVar5 + 0x10;
      } while (lVar5 != 0x30);
      lVar4 = lVar4 + 1;
      pfVar1 = pfVar1 + 1;
      lVar2 = lVar2 + 0x10;
    } while (lVar4 != 4);
    local_a8.m_data.m_data[0].m_data._0_8_ = *(undefined8 *)evalCtx->in[0].m_data;
    local_a8.m_data.m_data[0].m_data._8_8_ = *(undefined8 *)(evalCtx->in[0].m_data + 2);
    local_a8.m_data.m_data[1].m_data._0_8_ = *(undefined8 *)evalCtx->in[1].m_data;
    local_a8.m_data.m_data[1].m_data._8_8_ = *(undefined8 *)(evalCtx->in[1].m_data + 2);
    local_a8.m_data.m_data[2].m_data._0_8_ = *(undefined8 *)evalCtx->in[2].m_data;
    local_a8.m_data.m_data[2].m_data._8_8_ = *(undefined8 *)(evalCtx->in[2].m_data + 2);
  }
  else {
    local_a8.m_data.m_data[2].m_data[0] = 0.0;
    local_a8.m_data.m_data[2].m_data[1] = 0.0;
    local_a8.m_data.m_data[2].m_data[2] = 0.0;
    local_a8.m_data.m_data[2].m_data[3] = 0.0;
    local_a8.m_data.m_data[1].m_data[0] = 0.0;
    local_a8.m_data.m_data[1].m_data[1] = 0.0;
    local_a8.m_data.m_data[1].m_data[2] = 0.0;
    local_a8.m_data.m_data[1].m_data[3] = 0.0;
    local_a8.m_data.m_data[0].m_data[0] = 0.0;
    local_a8.m_data.m_data[0].m_data[1] = 0.0;
    local_a8.m_data.m_data[0].m_data[2] = 0.0;
    local_a8.m_data.m_data[0].m_data[3] = 0.0;
    puVar3 = &DAT_00b1d4e0;
    lVar2 = 0;
    do {
      lVar4 = 0;
      do {
        pfVar1[lVar4] = *(float *)((long)puVar3 + lVar4);
        lVar4 = lVar4 + 4;
      } while (lVar4 != 0xc);
      lVar2 = lVar2 + 1;
      pfVar1 = pfVar1 + 1;
      puVar3 = puVar3 + 3;
    } while (lVar2 != 4);
  }
  tcu::operator/(&local_40,&local_78,&local_a8);
  local_b4[0] = local_40.m_data.m_data[0].m_data[0];
  local_b4[1] = local_40.m_data.m_data[0].m_data[1];
  local_b4[2] = local_40.m_data.m_data[0].m_data[2];
  local_c0[0] = local_40.m_data.m_data[1].m_data[1];
  local_c0[1] = local_40.m_data.m_data[1].m_data[2];
  local_c0[2] = local_40.m_data.m_data[1].m_data[3];
  local_f0 = (Vec4 *)0x0;
  local_e8 = (ulong)local_e8._4_4_ << 0x20;
  lVar2 = 0;
  do {
    *(float *)((long)&local_f0 + lVar2 * 4) = local_e0[lVar2 + 0xb] + local_e0[lVar2 + 8];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_e0[5] = local_40.m_data.m_data[2].m_data[2];
  local_e0[6] = local_40.m_data.m_data[2].m_data[3];
  local_e0[7] = local_40.m_data.m_data[2].m_data[0];
  local_e0[2] = 0.0;
  local_e0[3] = 0.0;
  local_e0[4] = 0.0;
  lVar2 = 0;
  do {
    local_e0[lVar2 + 2] = *(float *)((long)&local_f0 + lVar2 * 4) + local_e0[lVar2 + 5];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_f0 = &evalCtx->color;
  local_e8 = 0x100000000;
  local_e0[0] = 2.8026e-45;
  lVar2 = 2;
  do {
    (evalCtx->color).m_data[*(int *)((long)&local_f0 + lVar2 * 4)] = local_e0[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(in0 / in1);
	}